

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void rnn_prepdb(rnndb *db)

{
  int local_14;
  int i;
  rnndb *db_local;
  
  for (local_14 = 0; local_14 < db->enumsnum; local_14 = local_14 + 1) {
    prepenum(db,db->enums[local_14]);
  }
  for (local_14 = 0; local_14 < db->bitsetsnum; local_14 = local_14 + 1) {
    prepbitset(db,db->bitsets[local_14]);
  }
  for (local_14 = 0; local_14 < db->domainsnum; local_14 = local_14 + 1) {
    prepdomain(db,db->domains[local_14]);
  }
  for (local_14 = 0; local_14 < db->spectypesnum; local_14 = local_14 + 1) {
    prepspectype(db,db->spectypes[local_14]);
  }
  return;
}

Assistant:

void rnn_prepdb (struct rnndb *db) {
	int i;
	for (i = 0; i < db->enumsnum; i++)
		prepenum(db, db->enums[i]);
	for (i = 0; i < db->bitsetsnum; i++)
		prepbitset(db, db->bitsets[i]);
	for (i = 0; i < db->domainsnum; i++)
		prepdomain(db, db->domains[i]);
	for (i = 0; i < db->spectypesnum; i++)
		prepspectype(db, db->spectypes[i]);
}